

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRationalAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Rational>::writeValueTo
          (TypedAttribute<Imf_3_4::Rational> *this,OStream *os,int version)

{
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).n);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).d);
  return;
}

Assistant:

IMF_EXPORT void
RationalAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.n);
    Xdr::write<StreamIO> (os, _value.d);
}